

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O3

void aom_paeth_predictor_64x64_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined8 uVar12;
  undefined8 uVar13;
  long lVar14;
  int iVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [32];
  
  auVar2 = vpmovzxbw_avx(*(undefined1 (*) [16])above);
  auVar3 = vpunpckhbw_avx(*(undefined1 (*) [16])above,(undefined1  [16])0x0);
  auVar16._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
  auVar16._16_16_ = ZEXT116(1) * auVar3;
  auVar18 = ZEXT3264(auVar16);
  auVar2 = vpmovzxbw_avx(*(undefined1 (*) [16])(above + 0x10));
  auVar3 = vpunpckhbw_avx(*(undefined1 (*) [16])(above + 0x10),(undefined1  [16])0x0);
  auVar19._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
  auVar19._16_16_ = ZEXT116(1) * auVar3;
  auVar21 = ZEXT3264(auVar19);
  auVar2 = vpmovzxbw_avx(*(undefined1 (*) [16])(above + 0x20));
  auVar3 = vpunpckhbw_avx(*(undefined1 (*) [16])(above + 0x20),(undefined1  [16])0x0);
  auVar22._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
  auVar22._16_16_ = ZEXT116(1) * auVar3;
  auVar24 = ZEXT3264(auVar22);
  auVar2 = vpmovzxbw_avx(*(undefined1 (*) [16])(above + 0x30));
  auVar3 = vpunpckhbw_avx(*(undefined1 (*) [16])(above + 0x30),(undefined1  [16])0x0);
  auVar25._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
  auVar25._16_16_ = ZEXT116(1) * auVar3;
  bVar1 = above[-1];
  auVar26[1] = 0;
  auVar26[0] = bVar1;
  auVar26[2] = bVar1;
  auVar26[3] = 0;
  auVar26[4] = bVar1;
  auVar26[5] = 0;
  auVar26[6] = bVar1;
  auVar26[7] = 0;
  auVar26[8] = bVar1;
  auVar26[9] = 0;
  auVar26[10] = bVar1;
  auVar26[0xb] = 0;
  auVar26[0xc] = bVar1;
  auVar26[0xd] = 0;
  auVar26[0xe] = bVar1;
  auVar26[0xf] = 0;
  auVar26[0x10] = bVar1;
  auVar26[0x11] = 0;
  auVar26[0x12] = bVar1;
  auVar26[0x13] = 0;
  auVar26[0x14] = bVar1;
  auVar26[0x15] = 0;
  auVar26[0x16] = bVar1;
  auVar26[0x17] = 0;
  auVar26[0x18] = bVar1;
  auVar26[0x19] = 0;
  auVar26[0x1a] = bVar1;
  auVar26[0x1b] = 0;
  auVar26[0x1c] = bVar1;
  auVar26[0x1d] = 0;
  auVar26[0x1e] = bVar1;
  auVar26[0x1f] = 0;
  auVar8 = vpsubw_avx2(auVar16,auVar26);
  auVar16 = vpabsw_avx2(auVar8);
  auVar19 = vpsubw_avx2(auVar19,auVar26);
  auVar29 = ZEXT3264(auVar19);
  auVar19 = vpabsw_avx2(auVar19);
  auVar30 = ZEXT3264(auVar19);
  auVar9 = vpsubw_avx2(auVar22,auVar26);
  auVar19 = vpabsw_avx2(auVar9);
  auVar10 = vpsubw_avx2(auVar25,auVar26);
  auVar22 = vpabsw_avx2(auVar10);
  lVar14 = 0;
  do {
    uVar12 = *(undefined8 *)*(undefined1 (*) [16])(left + lVar14 * 0x10 + 0x10);
    uVar13 = *(undefined8 *)(left + lVar14 * 0x10 + 0x18);
    auVar2 = *(undefined1 (*) [16])(left + lVar14 * 0x10 + 0x10);
    auVar31._8_8_ = 0x8000800080008000;
    auVar31._0_8_ = 0x8000800080008000;
    auVar31._16_8_ = 0x8000800080008000;
    auVar31._24_8_ = 0x8000800080008000;
    iVar15 = 0x10;
    do {
      auVar11._16_8_ = uVar12;
      auVar11._0_16_ = auVar2;
      auVar11._24_8_ = uVar13;
      auVar7 = vpshufb_avx2(auVar11,auVar31);
      auVar4 = vpaddw_avx2(auVar7,auVar8);
      auVar17 = auVar18._0_32_;
      auVar11 = vpsubw_avx2(auVar4,auVar17);
      auVar11 = vpabsw_avx2(auVar11);
      auVar4 = vpsubw_avx2(auVar4,auVar26);
      auVar4 = vpabsw_avx2(auVar4);
      auVar27 = vpminsw_avx2(auVar11,auVar4);
      auVar27 = vpcmpgtw_avx2(auVar16,auVar27);
      auVar11 = vpcmpgtw_avx2(auVar11,auVar4);
      auVar4 = vpandn_avx2(auVar27,auVar7);
      auVar11 = vpblendvb_avx2(auVar17,auVar26,auVar11);
      auVar11 = vpand_avx2(auVar27,auVar11);
      auVar28 = vpor_avx2(auVar4,auVar11);
      auVar4 = vpaddw_avx2(auVar29._0_32_,auVar7);
      auVar20 = auVar21._0_32_;
      auVar11 = vpsubw_avx2(auVar4,auVar20);
      auVar11 = vpabsw_avx2(auVar11);
      auVar4 = vpsubw_avx2(auVar4,auVar26);
      auVar4 = vpabsw_avx2(auVar4);
      auVar27 = vpminsw_avx2(auVar11,auVar4);
      auVar27 = vpcmpgtw_avx2(auVar30._0_32_,auVar27);
      auVar11 = vpcmpgtw_avx2(auVar11,auVar4);
      auVar11 = vpblendvb_avx2(auVar20,auVar26,auVar11);
      auVar4 = vpandn_avx2(auVar27,auVar7);
      auVar11 = vpand_avx2(auVar27,auVar11);
      auVar5 = vpor_avx2(auVar4,auVar11);
      auVar4 = vpaddw_avx2(auVar9,auVar7);
      auVar23 = auVar24._0_32_;
      auVar11 = vpsubw_avx2(auVar4,auVar23);
      auVar11 = vpabsw_avx2(auVar11);
      auVar4 = vpsubw_avx2(auVar4,auVar26);
      auVar4 = vpabsw_avx2(auVar4);
      auVar27 = vpminsw_avx2(auVar11,auVar4);
      auVar27 = vpcmpgtw_avx2(auVar19,auVar27);
      auVar11 = vpcmpgtw_avx2(auVar11,auVar4);
      auVar4 = vpandn_avx2(auVar27,auVar7);
      auVar11 = vpblendvb_avx2(auVar23,auVar26,auVar11);
      auVar11 = vpand_avx2(auVar27,auVar11);
      auVar6 = vpor_avx2(auVar4,auVar11);
      auVar4 = vpaddw_avx2(auVar7,auVar10);
      auVar11 = vpsubw_avx2(auVar4,auVar25);
      auVar11 = vpabsw_avx2(auVar11);
      auVar4 = vpsubw_avx2(auVar4,auVar26);
      auVar4 = vpabsw_avx2(auVar4);
      auVar27 = vpminsw_avx2(auVar11,auVar4);
      auVar11 = vpcmpgtw_avx2(auVar11,auVar4);
      auVar27 = vpcmpgtw_avx2(auVar22,auVar27);
      auVar4 = vpandn_avx2(auVar27,auVar7);
      auVar11 = vpblendvb_avx2(auVar25,auVar26,auVar11);
      auVar11 = vpand_avx2(auVar27,auVar11);
      auVar4 = vpor_avx2(auVar4,auVar11);
      auVar30 = ZEXT3264(auVar30._0_32_);
      auVar18 = ZEXT3264(auVar17);
      auVar21 = ZEXT3264(auVar20);
      auVar24 = ZEXT3264(auVar23);
      auVar11 = vperm2i128_avx2(auVar28,auVar5,0x31);
      auVar27._0_16_ = ZEXT116(0) * auVar5._0_16_ + ZEXT116(1) * auVar28._0_16_;
      auVar27._16_16_ = ZEXT116(0) * auVar28._16_16_ + ZEXT116(1) * auVar5._0_16_;
      auVar11 = vpackuswb_avx2(auVar27,auVar11);
      auVar29 = ZEXT3264(auVar29._0_32_);
      *(undefined1 (*) [32])dst = auVar11;
      auVar11 = vperm2i128_avx2(auVar6,auVar4,0x31);
      auVar28._0_16_ = ZEXT116(0) * auVar4._0_16_ + ZEXT116(1) * auVar6._0_16_;
      auVar28._16_16_ = ZEXT116(0) * auVar6._16_16_ + ZEXT116(1) * auVar4._0_16_;
      auVar11 = vpackuswb_avx2(auVar28,auVar11);
      auVar4 = vpcmpeqd_avx2(auVar28,auVar28);
      *(undefined1 (*) [32])((long)dst + 0x20) = auVar11;
      dst = *(undefined1 (*) [32])dst + stride;
      auVar31 = vpsubw_avx2(auVar31,auVar4);
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  return;
}

Assistant:

void aom_paeth_predictor_64x64_avx2(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  const __m256i t0 = get_top_vector(above);
  const __m256i t1 = get_top_vector(above + 16);
  const __m256i t2 = get_top_vector(above + 32);
  const __m256i t3 = get_top_vector(above + 48);
  const __m256i tl = _mm256_set1_epi16((int16_t)above[-1]);
  const __m256i one = _mm256_set1_epi16(1);

  int i, j;
  for (j = 0; j < 4; ++j) {
    const __m256i l = get_left_vector(left + j * 16);
    __m256i rep = _mm256_set1_epi16((short)0x8000);
    for (i = 0; i < 16; ++i) {
      const __m256i l16 = _mm256_shuffle_epi8(l, rep);

      const __m128i r0 = paeth_16x1_pred(&l16, &t0, &tl);
      const __m128i r1 = paeth_16x1_pred(&l16, &t1, &tl);
      const __m128i r2 = paeth_16x1_pred(&l16, &t2, &tl);
      const __m128i r3 = paeth_16x1_pred(&l16, &t3, &tl);

      _mm_store_si128((__m128i *)dst, r0);
      _mm_store_si128((__m128i *)(dst + 16), r1);
      _mm_store_si128((__m128i *)(dst + 32), r2);
      _mm_store_si128((__m128i *)(dst + 48), r3);

      dst += stride;
      rep = _mm256_add_epi16(rep, one);
    }
  }
}